

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.cpp
# Opt level: O3

bool __thiscall
duckdb::DictionaryCompressionCompressState::CalculateSpaceRequirements
          (DictionaryCompressionCompressState *this,bool new_string,idx_t string_size)

{
  byte bVar1;
  uint uVar2;
  pointer puVar3;
  pointer puVar4;
  __int_type _Var5;
  BlockManager *pBVar6;
  long lVar7;
  pointer pCVar8;
  idx_t iVar9;
  idx_t iVar10;
  unsigned_long uVar11;
  bitpacking_width_t bVar12;
  ulong uVar13;
  bitpacking_width_t bVar14;
  undefined7 in_register_00000031;
  bool bVar15;
  bool bVar16;
  
  if ((int)CONCAT71(in_register_00000031,new_string) == 0) {
    pCVar8 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
             operator->(&this->current_segment);
    _Var5 = (pCVar8->super_SegmentBase<duckdb::ColumnSegment>).count.
            super___atomic_base<unsigned_long>._M_i;
    uVar13 = _Var5 + 1;
    puVar3 = (this->index_buffer).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    puVar4 = (this->index_buffer).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar2 = (this->current_dictionary).size;
    bVar1 = this->current_width;
    pBVar6 = (this->super_DictionaryCompressionState).super_CompressionState.info.block_manager;
    iVar9 = optional_idx::GetIndex(&pBVar6->block_alloc_size);
    iVar10 = optional_idx::GetIndex(&pBVar6->block_header_size);
    if ((uVar13 & 0x1f) != 0) {
      uVar11 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)uVar13 & 0x1f);
      uVar13 = (_Var5 - uVar11) + 0x21;
    }
    uVar13 = (long)puVar3 + (uVar13 * bVar1 >> 3) + ((ulong)uVar2 - (long)puVar4) + 0x14;
    bVar15 = uVar13 < iVar9 - iVar10;
    bVar16 = uVar13 == iVar9 - iVar10;
  }
  else {
    puVar3 = (this->index_buffer).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    puVar4 = (this->index_buffer).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar13 = (long)puVar3 - (long)puVar4 >> 2;
    lVar7 = 0x3f;
    if (uVar13 != 0) {
      for (; uVar13 >> lVar7 == 0; lVar7 = lVar7 + -1) {
      }
    }
    bVar14 = '@';
    if (uVar13 >> 0x38 == 0) {
      bVar14 = '@' - ((byte)lVar7 ^ 0x3f);
    }
    bVar12 = '\0';
    if (puVar3 != puVar4) {
      bVar12 = bVar14;
    }
    this->next_width = bVar12;
    pCVar8 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
             operator->(&this->current_segment);
    _Var5 = (pCVar8->super_SegmentBase<duckdb::ColumnSegment>).count.
            super___atomic_base<unsigned_long>._M_i;
    uVar13 = _Var5 + 1;
    puVar3 = (this->index_buffer).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    puVar4 = (this->index_buffer).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar2 = (this->current_dictionary).size;
    bVar1 = this->next_width;
    pBVar6 = (this->super_DictionaryCompressionState).super_CompressionState.info.block_manager;
    iVar9 = optional_idx::GetIndex(&pBVar6->block_alloc_size);
    iVar10 = optional_idx::GetIndex(&pBVar6->block_header_size);
    if ((uVar13 & 0x1f) != 0) {
      uVar11 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)uVar13 & 0x1f);
      uVar13 = (_Var5 - uVar11) + 0x21;
    }
    uVar13 = (long)puVar3 +
             (uVar13 * bVar1 >> 3) + (ulong)uVar2 + (string_size - (long)puVar4) + 0x18;
    bVar15 = uVar13 < iVar9 - iVar10;
    bVar16 = uVar13 == iVar9 - iVar10;
  }
  return bVar15 || bVar16;
}

Assistant:

bool DictionaryCompressionCompressState::CalculateSpaceRequirements(bool new_string, idx_t string_size) {
	if (!new_string) {
		return DictionaryCompression::HasEnoughSpace(current_segment->count.load() + 1, index_buffer.size(),
		                                             current_dictionary.size, current_width, info.GetBlockSize());
	}
	next_width = BitpackingPrimitives::MinimumBitWidth(index_buffer.size() - 1 + new_string);
	return DictionaryCompression::HasEnoughSpace(current_segment->count.load() + 1, index_buffer.size() + 1,
	                                             current_dictionary.size + string_size, next_width,
	                                             info.GetBlockSize());
}